

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

int nni_url_canonify_uri(char *out)

{
  byte bVar1;
  byte bVar2;
  ushort **ppuVar3;
  __int32_t **pp_Var4;
  long lVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  char cVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  long lVar18;
  bool bVar19;
  char cVar20;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  undefined1 auVar21 [16];
  
  lVar18 = 0;
  auVar21 = ZEXT416(0x2d5f7e2e);
  cVar26 = auVar21[3];
  cVar24 = auVar21[2];
  cVar22 = auVar21[1];
  cVar9 = auVar21[0];
  lVar16 = 0;
  do {
    for (; cVar20 = out[lVar16], cVar20 != '%'; lVar16 = lVar16 + 1) {
      if (cVar20 == '\0') {
        out[lVar18] = '\0';
        bVar7 = false;
        lVar16 = 0;
        lVar18 = 0;
        while( true ) {
          cVar9 = out[lVar18];
          lVar5 = lVar16;
          lVar6 = lVar18;
          while (cVar9 == '/') {
            if (bVar7) goto LAB_00118959;
            out[lVar5] = '/';
            lVar6 = lVar6 + -1;
            do {
              cVar9 = out[lVar6 + 1];
              lVar6 = lVar6 + 1;
            } while (cVar9 == '/');
            lVar5 = lVar5 + 1;
          }
          if (cVar9 == '\0') break;
          lVar16 = lVar5;
          lVar18 = lVar6;
          if ((cVar9 == '#') || (cVar9 == '?')) {
LAB_00118959:
            bVar7 = true;
            lVar5 = lVar16;
            lVar6 = lVar18;
          }
          out[lVar5] = cVar9;
          lVar16 = lVar5 + 1;
          lVar18 = lVar6 + 1;
        }
        out[lVar5] = '\0';
        bVar7 = false;
        lVar16 = 0;
        lVar18 = 0;
LAB_00118983:
        uVar11 = (ulong)(byte)out[lVar18];
        lVar6 = lVar18;
        lVar5 = lVar16;
LAB_0011898d:
        lVar12 = lVar6 + 3;
        do {
          cVar9 = (char)uVar11;
          if (cVar9 != '/') {
            iVar10 = (int)uVar11;
            if (iVar10 == 0) {
              out[lVar5] = '\0';
              do {
                while( true ) {
                  bVar1 = *out;
                  if (bVar1 == 0) {
                    return 0;
                  }
                  if ((char)bVar1 < '\0') break;
                  out = (char *)((byte *)out + 1);
                }
                uVar15 = (uint)bVar1;
                uVar14 = 0x80;
                uVar13 = 0x1f;
                uVar17 = 1;
                if ((uVar15 & 0xffffffe0) != 0xc0) {
                  uVar14 = 0x800;
                  uVar13 = 0xf;
                  uVar17 = 2;
                  if ((uVar15 & 0xfffffff0) != 0xe0) {
                    uVar14 = 0x10000;
                    uVar13 = 7;
                    uVar17 = 3;
                    if ((uVar15 & 0xfffffff8) != 0xf0) {
                      return 3;
                    }
                  }
                }
                out = (char *)((byte *)out + (ulong)uVar17 + 1);
                if (uVar17 != 0) {
                  return 3;
                }
                if ((uVar13 & uVar15) < uVar14) {
                  return 3;
                }
              } while ((uVar13 & uVar15) < 0x110000);
              return 3;
            }
            lVar16 = lVar5;
            lVar18 = lVar6;
            if ((iVar10 == 0x23) || (iVar10 == 0x3f)) goto LAB_00118a2d;
LAB_00118a3a:
            lVar18 = lVar12 + -3;
            lVar16 = lVar5;
LAB_00118a3d:
            out[lVar16] = cVar9;
            lVar18 = lVar18 + 1;
            lVar16 = lVar16 + 1;
            goto LAB_00118983;
          }
          if (bVar7) {
LAB_00118a2d:
            bVar7 = true;
            goto LAB_00118a3d;
          }
          if ((((out[lVar12 + -2] == '.') && (out[lVar12 + -1] == '.')) &&
              (uVar11 = (ulong)(byte)out[lVar12], uVar11 < 0x40)) &&
             ((0x8000800800000001U >> (uVar11 & 0x3f) & 1) != 0)) goto LAB_001189e6;
          if (out[lVar12 + -2] != '.') {
            cVar9 = '/';
            bVar7 = false;
            goto LAB_00118a3a;
          }
          uVar11 = (ulong)(byte)out[lVar12 + -1];
          if ((0x3f < uVar11) || ((0x8000800800000001U >> (uVar11 & 0x3f) & 1) == 0)) {
            cVar9 = '/';
            bVar7 = false;
            lVar16 = lVar5;
            lVar18 = lVar6;
            goto LAB_00118a3d;
          }
          lVar12 = lVar12 + 2;
          lVar6 = lVar6 + 2;
        } while( true );
      }
      out[lVar18] = cVar20;
      lVar18 = lVar18 + 1;
    }
    ppuVar3 = __ctype_b_loc();
    if (((*(byte *)((long)*ppuVar3 + (long)out[lVar16 + 1] * 2 + 1) & 0x10) == 0) ||
       (cVar20 = out[lVar16 + 2], (*(byte *)((long)*ppuVar3 + (long)cVar20 * 2 + 1) & 0x10) == 0)) {
      return 3;
    }
    bVar1 = url_hex_val(out[lVar16 + 1]);
    bVar2 = url_hex_val(cVar20);
    bVar2 = bVar2 | bVar1 << 4;
    if ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a) {
LAB_00118879:
      out[lVar18] = bVar2;
      lVar18 = lVar18 + 1;
    }
    else {
      auVar21 = pshuflw(ZEXT216(CONCAT11(bVar2,bVar2)),ZEXT216(CONCAT11(bVar2,bVar2)),0);
      cVar27 = auVar21[3];
      cVar25 = auVar21[2];
      cVar23 = auVar21[1];
      cVar20 = auVar21[0];
      auVar21[0] = -(cVar20 == cVar9);
      auVar21[1] = -(cVar20 == cVar9);
      auVar21[2] = -(cVar20 == cVar9);
      auVar21[3] = -(cVar20 == cVar9);
      auVar21[4] = -(cVar23 == cVar22);
      auVar21[5] = -(cVar23 == cVar22);
      auVar21[6] = -(cVar23 == cVar22);
      auVar21[7] = -(cVar23 == cVar22);
      auVar21[8] = -(cVar25 == cVar24);
      auVar21[9] = -(cVar25 == cVar24);
      auVar21[10] = -(cVar25 == cVar24);
      auVar21[0xb] = -(cVar25 == cVar24);
      auVar21[0xc] = -(cVar27 == cVar26);
      auVar21[0xd] = -(cVar27 == cVar26);
      auVar21[0xe] = -(cVar27 == cVar26);
      auVar21[0xf] = -(cVar27 == cVar26);
      iVar10 = movmskps((uint)bVar2,auVar21);
      if (((iVar10 != 0) || ((char)(bVar1 << 4) < '\0')) || (2 < bVar1 && bVar2 < 0x3a))
      goto LAB_00118879;
      out[lVar18] = '%';
      pp_Var4 = __ctype_toupper_loc();
      out[lVar18 + 1] = (char)(*pp_Var4)[(byte)out[lVar16 + 1]];
      out[lVar18 + 2] = (char)(*pp_Var4)[(byte)out[lVar16 + 2]];
      lVar18 = lVar18 + 3;
    }
    lVar16 = lVar16 + 3;
  } while( true );
LAB_001189e6:
  bVar19 = lVar5 != 0;
  lVar8 = lVar5;
  lVar6 = lVar12;
  lVar5 = 0;
  if (bVar19) {
    do {
      if (lVar8 == 1) {
        lVar5 = 0;
        break;
      }
      lVar5 = lVar8 + -1;
      lVar12 = lVar8 + -1;
      lVar8 = lVar5;
    } while (out[lVar12] != '/');
  }
  goto LAB_0011898d;
}

Assistant:

int
nni_url_canonify_uri(char *out)
{
	size_t  src, dst;
	uint8_t c;
	int     rv;
	bool    skip;

	// First pass, convert '%xx' for safe characters to unescaped forms.
	src = dst = 0;
	while ((c = out[src]) != 0) {
		if (c == '%') {
			if ((!isxdigit(out[src + 1])) ||
			    (!isxdigit(out[src + 2]))) {
				return (NNG_EINVAL);
			}
			c = url_hex_val(out[src + 1]);
			c *= 16;
			c += url_hex_val(out[src + 2]);
			// If it's a safe character, decode, otherwise leave
			// it alone.  We also decode valid high-bytes for
			// UTF-8, which will let us validate them and use
			// those characters in file names later.
			if (((c >= 'A') && (c <= 'Z')) ||
			    ((c >= 'a') && (c <= 'z')) ||
			    ((c >= '0') && (c <= '9')) || (c == '.') ||
			    (c == '~') || (c == '_') || (c == '-') ||
			    (c >= 0x80)) {
				out[dst++] = (char) c;
			} else {
				out[dst++] = '%';
				out[dst++] = toupper((uint8_t) out[src + 1]);
				out[dst++] = toupper((uint8_t) out[src + 2]);
			}
			src += 3;
			continue;
		} else {
			out[dst++] = out[src++];
		}
	}
	out[dst] = 0;

	// Second pass, eliminate redundant //.
	src = dst = 0;
	skip      = false;
	while ((c = out[src]) != 0) {
		if ((c == '/') && (!skip)) {
			out[dst++] = '/';
			while (out[src] == '/') {
				src++;
			}
			continue;
		}
		if ((c == '?') || (c == '#')) {
			skip = true;
		}
		out[dst++] = (char) c;
		src++;
	}
	out[dst] = 0;

	// Second pass, reduce /. and /.. elements, but only in the path.
	src = dst = 0;
	skip      = false;
	while ((c = out[src]) != 0) {
		if ((c == '/') && (!skip)) {
			if ((strncmp(out + src, "/..", 3) == 0) &&
			    (out[src + 3] == 0 || out[src + 3] == '#' ||
			        out[src + 3] == '?' || out[src + 3] == '/')) {

				if (dst > 0) {
					do {
						dst--;
					} while ((dst) && (out[dst] != '/'));
				}
				src += 3;
				continue;
			}
			if ((strncmp(out + src, "/.", 2) == 0) &&
			    (out[src + 2] == 0 || out[src + 2] == '#' ||
			        out[src + 2] == '?' || out[src + 2] == '/')) {
				src += 2; // just skip over it
				continue;
			}
			out[dst++] = '/';
			src++;
		} else {
			if ((c == '?') || (c == '#')) {
				skip = true;
			}
			out[dst++] = (char) c;
			src++;
		}
	}
	out[dst] = 0;

	// Finally lets make sure that the results are valid UTF-8.
	// This guards against using UTF-8 redundancy to break security.
	if ((rv = url_utf8_validate(out)) != 0) {
		return (rv);
	}

	return (0);
}